

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

bool __thiscall slang::ast::SubroutineSymbol::hasOutputArgs(SubroutineSymbol *this)

{
  bool bVar1;
  reference ppFVar2;
  bool *pbVar3;
  long in_RDI;
  FormalArgumentSymbol *arg;
  iterator __end3;
  iterator __begin3;
  ArgList *__range3;
  SubroutineSymbol *in_stack_ffffffffffffff98;
  bitmask<slang::ast::VariableFlags> *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar4;
  undefined2 local_44;
  bitmask<slang::ast::VariableFlags> local_42;
  FormalArgumentSymbol *local_40;
  FormalArgumentSymbol **local_38;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_30;
  ArgList local_28;
  ArgList *local_18;
  undefined1 local_b;
  undefined2 local_a;
  
  bVar1 = std::optional<bool>::has_value((optional<bool> *)0x5224af);
  if (!bVar1) {
    local_b = 0;
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffffa0,(bool *)in_stack_ffffffffffffff98);
    *(undefined2 *)(in_RDI + 0x118) = local_a;
    local_28 = getArguments(in_stack_ffffffffffffff98);
    local_18 = &local_28;
    local_30._M_current =
         (FormalArgumentSymbol **)
         std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                    in_stack_ffffffffffffff98);
    local_38 = (FormalArgumentSymbol **)
               std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                         ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                           *)CONCAT17(in_stack_ffffffffffffffaf,
                                      CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8))
                         );
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff98), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                ::operator*(&local_30);
      local_40 = *ppFVar2;
      bVar4 = 0;
      if ((local_40->direction != In) && (bVar4 = 1, local_40->direction == Ref)) {
        in_stack_ffffffffffffffa0 = &(local_40->super_VariableSymbol).flags;
        bitmask<slang::ast::VariableFlags>::bitmask(&local_42,Const);
        bVar1 = bitmask<slang::ast::VariableFlags>::has
                          (in_stack_ffffffffffffffa0,
                           (bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff98);
        bVar4 = bVar1 ^ 0xff;
      }
      if ((bVar4 & 1) != 0) {
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)in_stack_ffffffffffffffa0,(bool *)in_stack_ffffffffffffff98);
        *(undefined2 *)(in_RDI + 0x118) = local_44;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
      ::operator++(&local_30);
    }
  }
  pbVar3 = std::optional<bool>::operator*((optional<bool> *)0x5225f8);
  return (bool)(*pbVar3 & 1);
}

Assistant:

bool SubroutineSymbol::hasOutputArgs() const {
    if (!cachedHasOutputArgs.has_value()) {
        cachedHasOutputArgs = false;
        for (auto arg : getArguments()) {
            if (arg->direction != ArgumentDirection::In &&
                (arg->direction != ArgumentDirection::Ref ||
                 !arg->flags.has(VariableFlags::Const))) {
                cachedHasOutputArgs = true;
                break;
            }
        }
    }
    return *cachedHasOutputArgs;
}